

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

void GPU_RegisterRenderer
               (GPU_RendererID id,_func_GPU_Renderer_ptr_GPU_RendererID *create_renderer,
               _func_void_GPU_Renderer_ptr *free_renderer)

{
  GPU_RendererID GVar1;
  int iVar2;
  char *details;
  
  GVar1 = id;
  iVar2 = GPU_GetNumRegisteredRenderers();
  if (9 < iVar2) {
    return;
  }
  if (id.renderer == 0) {
    details = "Invalid renderer ID";
  }
  else if (create_renderer == (_func_GPU_Renderer_ptr_GPU_RendererID *)0x0) {
    details = "NULL renderer create callback";
  }
  else {
    if (free_renderer != (_func_void_GPU_Renderer_ptr *)0x0) {
      _gpu_renderer_register[iVar2].id.minor_version = id.minor_version;
      *(undefined4 *)&_gpu_renderer_register[iVar2].id.field_0x14 = id._20_4_;
      _gpu_renderer_register[iVar2].id.name = id.name;
      _gpu_renderer_register[iVar2].id.renderer = (int)GVar1._8_8_;
      _gpu_renderer_register[iVar2].id.major_version = (int)((ulong)GVar1._8_8_ >> 0x20);
      _gpu_renderer_register[iVar2].createFn = create_renderer;
      _gpu_renderer_register[iVar2].freeFn = free_renderer;
      return;
    }
    details = "NULL renderer free callback";
  }
  GPU_PushErrorCode("GPU_RegisterRenderer",GPU_ERROR_USER_ERROR,details);
  return;
}

Assistant:

void GPU_RegisterRenderer(GPU_RendererID id, GPU_Renderer* (*create_renderer)(GPU_RendererID request), void (*free_renderer)(GPU_Renderer* renderer))
{
    int i = GPU_GetNumRegisteredRenderers();
    
	if(i >= GPU_MAX_REGISTERED_RENDERERS)
		return;
    
    if(id.renderer == GPU_RENDERER_UNKNOWN)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Invalid renderer ID");
        return;
    }
    if(create_renderer == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "NULL renderer create callback");
        return;
    }
    if(free_renderer == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "NULL renderer free callback");
        return;
    }
    
    _gpu_renderer_register[i].id = id;
    _gpu_renderer_register[i].createFn = create_renderer;
    _gpu_renderer_register[i].freeFn = free_renderer;
}